

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

bool __thiscall
FilterReplayer::enqueue_create_compute_pipeline
          (FilterReplayer *this,Hash hash,VkComputePipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  VkPipeline_T *pVVar1;
  size_type sVar2;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar3;
  VkPipeline local_60;
  _Node_iterator_base<unsigned_long,_false> local_58;
  undefined1 local_50;
  VkPipeline local_48;
  VkPipeline local_40;
  bool local_31;
  VkPipeline *ppVStack_30;
  bool active;
  VkPipeline *pipeline_local;
  VkComputePipelineCreateInfo *create_info_local;
  Hash hash_local;
  FilterReplayer *this_local;
  
  ppVStack_30 = pipeline;
  pipeline_local = (VkPipeline *)create_info;
  create_info_local = (VkComputePipelineCreateInfo *)hash;
  hash_local = (Hash)this;
  pVVar1 = fake_handle<VkPipeline_T*>(hash);
  *ppVStack_30 = pVVar1;
  sVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::count(&this->filter_compute,(key_type *)&create_info_local);
  if (sVar2 == 0) {
    local_40 = pipeline_local[6];
    sVar2 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(&this->filter_modules,(key_type *)&local_40);
    local_31 = sVar2 != 0;
  }
  else {
    local_31 = true;
  }
  if (local_31 != false) {
    if (pipeline_local[10] != (VkPipeline)0x0) {
      local_48 = pipeline_local[10];
      pVar3 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(&this->filter_compute,(value_type *)&local_48);
      local_58._M_cur =
           (__node_type *)pVar3.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_50 = pVar3.second;
    }
    local_60 = pipeline_local[6];
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->filter_modules_promoted,(value_type *)&local_60);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->filter_compute,(value_type *)&create_info_local);
  }
  return true;
}

Assistant:

bool enqueue_create_compute_pipeline(Hash hash, const VkComputePipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);

		// We are active if we either explicitly add the pipeline, or we explicitly add one of the module dependencies.
		bool active;
		if (filter_compute.count(hash) != 0)
			active = true;
		else
			active = filter_modules.count((Hash)create_info->stage.module) != 0;

		if (!active)
			return true;

		// If the pipeline is to be emitted, promote all dependencies to be active as well.
		if (create_info->basePipelineHandle != VK_NULL_HANDLE)
			filter_compute.insert((Hash)create_info->basePipelineHandle);
		filter_modules_promoted.insert((Hash)create_info->stage.module);
		filter_compute.insert(hash);

		return true;
	}